

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_sameName(ENCODING *enc,char *ptr1,char *ptr2)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  
LAB_003b1670:
  do {
    bVar3 = *ptr1;
    bVar4 = *(byte *)((long)enc[1].scanners + (ulong)bVar3);
    if (bVar4 < 0x1e) {
      if ((0x2f400000U >> (bVar4 & 0x1f) & 1) != 0) {
        ptr1 = (char *)((byte *)ptr1 + 1);
        bVar4 = *ptr2;
        ptr2 = (char *)((byte *)ptr2 + 1);
        if (bVar4 != bVar3) {
          return 0;
        }
        goto LAB_003b1670;
      }
      if (bVar4 != 6) {
        if (bVar4 != 7) goto LAB_003b16bb;
        if (bVar3 != *ptr2) {
          return 0;
        }
        ptr1 = (char *)((byte *)ptr1 + 1);
        ptr2 = (char *)((byte *)ptr2 + 1);
      }
      if (*ptr1 != *ptr2) {
        return 0;
      }
      ptr1 = (char *)((byte *)ptr1 + 1);
      ptr2 = (char *)((byte *)ptr2 + 1);
    }
    else {
LAB_003b16bb:
      if (bVar4 != 5) {
        if (bVar3 == *ptr2) {
          return 1;
        }
        uVar5 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr2);
        if (0x1d < uVar5) {
          return 1;
        }
        if ((0x2f4000e0U >> (uVar5 & 0x1f) & 1) == 0) {
          return 1;
        }
        return 0;
      }
    }
    if (*ptr1 != *ptr2) {
      return 0;
    }
    pbVar1 = (byte *)ptr1 + 1;
    ptr1 = (char *)((byte *)ptr1 + 2);
    pbVar2 = (byte *)ptr2 + 1;
    ptr2 = (char *)((byte *)ptr2 + 2);
    if (*pbVar1 != *pbVar2) {
      return 0;
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(sameName)(const ENCODING *enc, const char *ptr1, const char *ptr2)
{
  for (;;) {
    switch (BYTE_TYPE(enc, ptr1)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (*ptr1++ != *ptr2++) \
        return 0;
    LEAD_CASE(4) LEAD_CASE(3) LEAD_CASE(2)
#undef LEAD_CASE
      /* fall through */
      if (*ptr1++ != *ptr2++)
        return 0;
      break;
    case BT_NONASCII:
    case BT_NMSTRT:
#ifdef XML_NS
    case BT_COLON:
#endif
    case BT_HEX:
    case BT_DIGIT:
    case BT_NAME:
    case BT_MINUS:
      if (*ptr2++ != *ptr1++)
        return 0;
      if (MINBPC(enc) > 1) {
        if (*ptr2++ != *ptr1++)
          return 0;
        if (MINBPC(enc) > 2) {
          if (*ptr2++ != *ptr1++)
            return 0;
          if (MINBPC(enc) > 3) {
            if (*ptr2++ != *ptr1++)
              return 0;
          }
        }
      }
      break;
    default:
      if (MINBPC(enc) == 1 && *ptr1 == *ptr2)
        return 1;
      switch (BYTE_TYPE(enc, ptr2)) {
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
      case BT_NONASCII:
      case BT_NMSTRT:
#ifdef XML_NS
      case BT_COLON:
#endif
      case BT_HEX:
      case BT_DIGIT:
      case BT_NAME:
      case BT_MINUS:
        return 0;
      default:
        return 1;
      }
    }
  }
  /* not reached */
}